

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

void __thiscall
google::protobuf::io::CodedInputStream::CodedInputStream
          (CodedInputStream *this,ZeroCopyInputStream *input)

{
  int iVar1;
  
  this->buffer_ = (uint8_t *)0x0;
  this->buffer_end_ = (uint8_t *)0x0;
  this->input_ = input;
  this->total_bytes_read_ = 0;
  this->overflow_bytes_ = 0;
  *(undefined8 *)((long)&this->overflow_bytes_ + 3) = 0;
  this->current_limit_ = 0x7fffffff;
  this->buffer_size_after_limit_ = 0;
  this->total_bytes_limit_ = 0x7fffffff;
  iVar1 = default_recursion_limit_;
  this->recursion_budget_ = default_recursion_limit_;
  this->recursion_limit_ = iVar1;
  this->extension_pool_ = (DescriptorPool *)0x0;
  this->extension_factory_ = (MessageFactory *)0x0;
  Refresh(this);
  return;
}

Assistant:

inline CodedInputStream::CodedInputStream(ZeroCopyInputStream* input)
    : buffer_(nullptr),
      buffer_end_(nullptr),
      input_(input),
      total_bytes_read_(0),
      overflow_bytes_(0),
      last_tag_(0),
      legitimate_message_end_(false),
      aliasing_enabled_(false),
      force_eager_parsing_(false),
      current_limit_(std::numeric_limits<int32_t>::max()),
      buffer_size_after_limit_(0),
      total_bytes_limit_(kDefaultTotalBytesLimit),
      recursion_budget_(default_recursion_limit_),
      recursion_limit_(default_recursion_limit_),
      extension_pool_(nullptr),
      extension_factory_(nullptr) {
  // Eagerly Refresh() so buffer space is immediately available.
  Refresh();
}